

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::CountSetBits_i64(w3Interp *this)

{
  bool bVar1;
  Value *pVVar2;
  Value VVar3;
  uint64_t uVar4;
  
  pVVar2 = w3Stack::value(&this->super_w3Stack,Tag_i64);
  uVar4 = pVVar2->u64;
  VVar3.u64 = 0;
  if (uVar4 != 0) {
    do {
      VVar3.i32 = VVar3.i32 + ((uint)uVar4 & 1);
      VVar3.u64._4_4_ = 0;
      bVar1 = 1 < uVar4;
      uVar4 = uVar4 >> 1;
    } while (bVar1);
    VVar3.u64._4_4_ = 0;
  }
  *pVVar2 = VVar3;
  return;
}

Assistant:

INTERP (CountSetBits_i64)
{
    uint64_t& a = u64 ();
#if _MSC_VER && _M_AMD64
    a = __popcnt64 (a);
#else
    a = count_set_bits (a);
#endif
}